

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

Bool tidyOptGetBool(TidyDoc tdoc,TidyOptionId optId)

{
  TidyOptionImpl *pTVar1;
  Bool BVar2;
  
  BVar2 = no;
  if (tdoc != (TidyDoc)0x0) {
    pTVar1 = prvTidygetOption(optId);
    BVar2 = no;
    if (pTVar1 != (TidyOptionImpl *)0x0) {
      BVar2 = tdoc[(ulong)optId * 2 + 0x1c]._opaque;
    }
  }
  return BVar2;
}

Assistant:

Bool TIDY_CALL         tidyOptGetBool( TidyDoc tdoc, TidyOptionId optId )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    Bool optb = no;
    if ( impl )
    {
        const TidyOptionImpl* option = TY_(getOption)( optId );
        if ( option )
        {
            optb = cfgBool( impl, optId );
        }
    }
    return optb;
}